

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O2

void R_DrawFogBoundary(int x1,int x2,short *uclip,short *dclip)

{
  lighttable_t *plVar1;
  double dVar2;
  int iVar3;
  SWORD *b2;
  long lVar4;
  int y2;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int y;
  int iVar8;
  short sVar9;
  long lVar10;
  int iVar11;
  double local_48;
  
  local_48 = (double)((float)(~x1 + x2) * rw_lightstep + rw_light);
  y = (int)uclip[(long)x2 + -1];
  y2 = (int)dclip[(long)x2 + -1];
  dVar2 = 24.0;
  if (local_48 <= 24.0) {
    dVar2 = local_48;
  }
  iVar7 = wallshade - SUB84(dVar2 + 103079215104.0,0) >> 0x10;
  if (0x1e < iVar7) {
    iVar7 = 0x1f;
  }
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  plVar1 = basecolormap->Maps;
  if (uclip[(long)x2 + -1] < dclip[(long)x2 + -1]) {
    for (uVar5 = 0; (uint)(y2 - y) != uVar5; uVar5 = uVar5 + 1) {
      spanend[(long)y + uVar5] = (short)x2 + -1;
    }
  }
  dc_colormap = plVar1 + (uint)(iVar7 << 8);
  for (lVar10 = (long)(x2 + -2); x1 <= lVar10; lVar10 = lVar10 + -1) {
    iVar6 = (int)uclip[lVar10];
    iVar3 = (int)dclip[lVar10];
    iVar8 = (int)lVar10 + 1;
    local_48 = local_48 - (double)rw_lightstep;
    dVar2 = local_48;
    if (24.0 <= local_48) {
      dVar2 = 24.0;
    }
    iVar11 = wallshade - SUB84(dVar2 + 103079215104.0,0) >> 0x10;
    if (0x1e < iVar11) {
      iVar11 = 0x1f;
    }
    if (iVar11 < 1) {
      iVar11 = 0;
    }
    sVar9 = (short)lVar10;
    if (iVar11 == iVar7) {
      iVar11 = y2;
      if (iVar6 < y2) {
        iVar11 = iVar6;
      }
      if (dc_colormap == plVar1) {
        if (iVar11 < y) {
          iVar11 = y;
        }
        y = iVar11;
        iVar8 = y;
        if (y < iVar3) {
          iVar8 = iVar3;
        }
        if (iVar8 <= y2) {
          y2 = iVar8;
        }
      }
      else {
        for (; y < iVar11; y = y + 1) {
          R_DrawFogBoundaryLine(y,iVar8);
        }
        iVar11 = y;
        if (y < iVar3) {
          iVar11 = iVar3;
        }
        while (iVar11 < y2) {
          y2 = y2 + -1;
          R_DrawFogBoundaryLine(y2,iVar8);
        }
      }
      iVar8 = iVar3;
      if (y < iVar3) {
        iVar8 = y;
      }
      for (lVar4 = (long)iVar6; lVar4 < iVar8; lVar4 = lVar4 + 1) {
        spanend[lVar4] = sVar9;
      }
      if (y < y2) {
        y = y2;
      }
      for (lVar4 = (long)iVar3; y < lVar4; lVar4 = lVar4 + -1) {
        ceilingclip[lVar4 + 0x167f] = sVar9;
      }
    }
    else {
      if ((y < y2) && (iVar7 != 0)) {
        R_DrawFogBoundarySection(y,y2,iVar8);
      }
      if (y < iVar6) {
        iVar6 = y;
      }
      if (iVar3 < y2) {
        iVar3 = y2;
      }
      if (iVar3 - iVar6 != 0 && iVar6 <= iVar3) {
        for (uVar5 = 0; (uint)(iVar3 - iVar6) != uVar5; uVar5 = uVar5 + 1) {
          spanend[(long)iVar6 + uVar5] = sVar9;
        }
      }
      dc_colormap = plVar1 + (uint)(iVar11 << 8);
      iVar7 = iVar11;
    }
    y = (int)uclip[lVar10];
    y2 = (int)dclip[lVar10];
  }
  if ((y < y2) && (iVar7 != 0)) {
    R_DrawFogBoundarySection(y,y2,x1);
    return;
  }
  return;
}

Assistant:

void R_DrawFogBoundary (int x1, int x2, short *uclip, short *dclip)
{
	// This is essentially the same as R_MapVisPlane but with an extra step
	// to create new horizontal spans whenever the light changes enough that
	// we need to use a new colormap.

	double lightstep = rw_lightstep;
	double light = rw_light + rw_lightstep*(x2-x1-1);
	int x = x2-1;
	int t2 = uclip[x];
	int b2 = dclip[x];
	int rcolormap = GETPALOOKUP(light, wallshade);
	int lcolormap;
	BYTE *basecolormapdata = basecolormap->Maps;

	if (b2 > t2)
	{
		clearbufshort (spanend+t2, b2-t2, x);
	}

	dc_colormap = basecolormapdata + (rcolormap << COLORMAPSHIFT);

	for (--x; x >= x1; --x)
	{
		int t1 = uclip[x];
		int b1 = dclip[x];
		const int xr = x+1;
		int stop;

		light -= rw_lightstep;
		lcolormap = GETPALOOKUP(light, wallshade);
		if (lcolormap != rcolormap)
		{
			if (t2 < b2 && rcolormap != 0)
			{ // Colormap 0 is always the identity map, so rendering it is
			  // just a waste of time.
				R_DrawFogBoundarySection (t2, b2, xr);
			}
			if (t1 < t2) t2 = t1;
			if (b1 > b2) b2 = b1;
			if (t2 < b2)
			{
				clearbufshort (spanend+t2, b2-t2, x);
			}
			rcolormap = lcolormap;
			dc_colormap = basecolormapdata + (lcolormap << COLORMAPSHIFT);
		}
		else
		{
			if (dc_colormap != basecolormapdata)
			{
				stop = MIN (t1, b2);
				while (t2 < stop)
				{
					R_DrawFogBoundaryLine (t2++, xr);
				}
				stop = MAX (b1, t2);
				while (b2 > stop)
				{
					R_DrawFogBoundaryLine (--b2, xr);
				}
			}
			else
			{
				t2 = MAX (t2, MIN (t1, b2));
				b2 = MIN (b2, MAX (b1, t2));
			}

			stop = MIN (t2, b1);
			while (t1 < stop)
			{
				spanend[t1++] = x;
			}
			stop = MAX (b2, t2);
			while (b1 > stop)
			{
				spanend[--b1] = x;
			}
		}

		t2 = uclip[x];
		b2 = dclip[x];
	}
	if (t2 < b2 && rcolormap != 0)
	{
		R_DrawFogBoundarySection (t2, b2, x1);
	}
}